

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  short sVar2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_SI;
  int in_EDI;
  int ret;
  int *unaff_retaddr;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined2 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffea;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffff0;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff6;
  short sVar5;
  short in_stack_fffffffffffffffe;
  
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff6);
  SVar4.m_int = in_SI.m_int;
  bVar1 = DivisionCornerCaseHelper<short,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    (in_EDI,in_SI,
                     (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xfffffffffffffff6);
  if ((!bVar1) &&
     (sVar5 = SVar4.m_int,
     bVar1 = DivisionCornerCaseHelper2<short,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
             ::DivisionCornerCase2
                       (CONCAT22(SVar4.m_int,in_stack_fffffffffffffff0),in_SI,
                        (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT44(in_stack_ffffffffffffffec,
                                 CONCAT22(in_stack_ffffffffffffffea,in_stack_ffffffffffffffe8))),
     !bVar1)) {
    uVar3 = 0;
    sVar2 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffff6.m_int,
                                CONCAT24(in_SI.m_int,CONCAT22(SVar4.m_int,in_stack_fffffffffffffff0)
                                        )));
    DivisionHelper<int,_short,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (unaff_retaddr,(short *)CONCAT26(in_stack_fffffffffffffffe,CONCAT24(sVar5,in_EDI)),
               (int *)CONCAT26(in_stack_fffffffffffffff6.m_int,
                               CONCAT24(in_SI.m_int,CONCAT22(SVar4.m_int,in_stack_fffffffffffffff0))
                              ));
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(in_stack_fffffffffffffff6.m_int,
                        CONCAT24(in_SI.m_int,CONCAT22(SVar4.m_int,in_stack_fffffffffffffff0))),
               (int *)CONCAT44(uVar3,CONCAT22(sVar2,in_stack_ffffffffffffffe8)));
    in_stack_fffffffffffffff6.m_int = in_stack_fffffffffffffffe;
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffff6.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}